

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeSwitch(TranslateToFuzzReader *this,Type type)

{
  string_view default_;
  value_type *ppEVar1;
  Type TVar2;
  Switch *pSVar3;
  Expression *pEVar4;
  Expression *value;
  TranslateToFuzzReader *this_00;
  Type type_00;
  int iVar5;
  bool bVar6;
  undefined1 local_58 [8];
  Name name;
  vector<wasm::Name,_std::allocator<wasm::Name>_> names;
  
  if (type.id != 1) {
    __assert_fail("type == Type::unreachable",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x10eb,"Expression *wasm::TranslateToFuzzReader::makeSwitch(Type)");
  }
  if ((this->funcContext->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->funcContext->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar5 = (this->fuzzParams->super_FuzzParams).TRIES;
    name.super_IString.str._M_str = (char *)0x0;
    type_00.id = 1;
    for (; default_ = sRamfffffffffffffff0, 0 < iVar5; iVar5 = iVar5 + -1) {
      this_00 = (TranslateToFuzzReader *)&this->random;
      ppEVar1 = Random::pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                          (&this->random,&this->funcContext->breakableStack);
      pEVar4 = *ppEVar1;
      _local_58 = (string_view)getTargetName(this_00,pEVar4);
      TVar2 = getTargetType(this_00,pEVar4);
      if ((name.super_IString.str._M_str == (char *)0x0) ||
         (bVar6 = type_00.id == TVar2.id, TVar2.id = type_00.id, bVar6)) {
        std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                  ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&name.super_IString.str._M_str
                   ,(value_type *)local_58);
        type_00.id = TVar2.id;
      }
    }
    if ((ulong)-(long)name.super_IString.str._M_str < 0x11) {
      pSVar3 = (Switch *)make(this,(Type)0x1);
    }
    else {
      pEVar4 = make(this,(Type)0x2);
      if (type_00.id < 2) {
        value = (Expression *)0x0;
      }
      else {
        value = make(this,type_00);
      }
      pSVar3 = Builder::makeSwitch<std::vector<wasm::Name,std::allocator<wasm::Name>>>
                         (&this->builder,
                          (vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                          &name.super_IString.str._M_str,(Name)default_,pEVar4,value);
    }
    std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
              ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)
               &name.super_IString.str._M_str);
    return (Expression *)pSVar3;
  }
  pEVar4 = make(this,(Type)0x1);
  return pEVar4;
}

Assistant:

Expression* TranslateToFuzzReader::makeSwitch(Type type) {
  assert(type == Type::unreachable);
  if (funcContext->breakableStack.empty()) {
    return make(type);
  }
  // we need to find proper targets to break to; try a bunch
  int tries = fuzzParams->TRIES;
  std::vector<Name> names;
  Type valueType = Type::unreachable;
  while (tries-- > 0) {
    auto* target = pick(funcContext->breakableStack);
    auto name = getTargetName(target);
    auto currValueType = getTargetType(target);
    if (names.empty()) {
      valueType = currValueType;
    } else {
      if (valueType != currValueType) {
        continue; // all values must be the same
      }
    }
    names.push_back(name);
  }
  if (names.size() < 2) {
    // we failed to find enough
    return make(type);
  }
  auto default_ = names.back();
  names.pop_back();
  auto temp1 = make(Type::i32),
       temp2 = valueType.isConcrete() ? make(valueType) : nullptr;
  return builder.makeSwitch(names, default_, temp1, temp2);
}